

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

int * Kit_TruthTest(char *pFileName)

{
  int iVar1;
  int iVar2;
  uint nVars;
  uint *pArray;
  int *piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar2 = Extra_FileSize(pFileName);
  nVars = Kit_TruthFindVarNum(pFileName);
  iVar1 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = 1 << ((char)nVars - 5U & 0x1f);
  if ((int)nVars < 6) {
    iVar2 = 1;
  }
  uVar6 = CONCAT44(iVar1 >> 0x1f,iVar1 >> 2) / (long)iVar2;
  pArray = (uint *)Extra_FileReadContents(pFileName);
  piVar3 = Kit_TruthStatsArray(pArray,nVars,(int)uVar6);
  printf("Finished proceessing %d functions with %d variables. ",uVar6 & 0xffffffff,(ulong)nVars);
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(iVar2,"%s =","Time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  if (pArray != (uint *)0x0) {
    free(pArray);
  }
  uVar6 = 0;
  do {
    printf("Function %3d :  AND2 = %3d  Lev = %3d\n",uVar6 & 0xffffffff,
           (ulong)(piVar3[uVar6] & 0xffff),(ulong)(uint)(piVar3[uVar6] >> 0x10));
    uVar6 = uVar6 + 1;
  } while (uVar6 != 5);
  return piVar3;
}

Assistant:

int * Kit_TruthTest( char * pFileName )
{
    abctime clk   = Abc_Clock(); int i;
    int nFileSize = Extra_FileSize( pFileName );
    int nVars     = Kit_TruthFindVarNum( pFileName );
    int nFuncs    = nFileSize / 4 / Abc_TruthWordNum(nVars);
    unsigned * pA = (unsigned *)Extra_FileReadContents( pFileName );
    int * pResult = Kit_TruthStatsArray( pA, nVars, nFuncs );
    printf( "Finished proceessing %d functions with %d variables. ", nFuncs, nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    ABC_FREE( pA );
    for ( i = 0; i < 5; i++ )
        printf( "Function %3d :  AND2 = %3d  Lev = %3d\n", i, pResult[i] & 0xFFFF, pResult[i] >> 16 );
    return pResult;
}